

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

ImGuiWindow ** __thiscall
ImVector<ImGuiWindow_*>::insert(ImVector<ImGuiWindow_*> *this,ImGuiWindow **it,ImGuiWindow **v)

{
  int *piVar1;
  ImGuiWindow **ppIVar2;
  int iVar3;
  ImGuiWindow **__dest;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  __dest = this->Data;
  lVar6 = (long)it - (long)__dest;
  iVar3 = this->Size;
  if (iVar3 == this->Capacity) {
    if (iVar3 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar3 / 2 + iVar3;
    }
    iVar7 = iVar3 + 1;
    if (iVar3 + 1 < iVar4) {
      iVar7 = iVar4;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar7 << 3,GImAllocatorUserData);
    if (this->Data != (ImGuiWindow **)0x0) {
      memcpy(__dest,this->Data,(long)this->Size << 3);
      ppIVar2 = this->Data;
      if ((ppIVar2 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar2,GImAllocatorUserData);
    }
    this->Data = __dest;
    this->Capacity = iVar7;
    iVar3 = this->Size;
  }
  lVar5 = (long)iVar3 - (lVar6 >> 3);
  if (lVar5 != 0 && lVar6 >> 3 <= (long)iVar3) {
    memmove((void *)((long)__dest + lVar6 + 8),(void *)((long)__dest + lVar6),lVar5 * 8);
    __dest = this->Data;
  }
  *(ImGuiWindow **)((long)__dest + lVar6) = *v;
  this->Size = this->Size + 1;
  return (ImGuiWindow **)(lVar6 + (long)this->Data);
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }